

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O3

QString * QBenchmarkValgrindUtils::outFileBase(QString *__return_storage_ptr__,qint64 pid)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QArrayData *local_30 [3];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1.m_data = (storage_type *)0x10;
  QVar1.m_size = (qsizetype)local_30;
  QString::fromLatin1(QVar1);
  if (pid == -1) {
    pid = QCoreApplication::applicationPid();
  }
  QString::arg_impl((longlong)__return_storage_ptr__,(int)local_30,(int)pid,(QChar)0x0);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QBenchmarkValgrindUtils::outFileBase(qint64 pid)
{
    return QString::fromLatin1("callgrind.out.%1").arg(
        pid != -1 ? pid : QCoreApplication::applicationPid());
}